

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_aead_decrypt(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *nonce,size_t nonce_length,
                uint8_t *additional_data,size_t additional_data_length,uint8_t *ciphertext,
                size_t ciphertext_length,uint8_t *plaintext,size_t plaintext_size,
                size_t *plaintext_length)

{
  int iVar1;
  psa_status_t pVar2;
  uint8_t *local_210;
  uint8_t *tag;
  aead_operation_t operation;
  psa_status_t status;
  size_t additional_data_length_local;
  uint8_t *additional_data_local;
  size_t nonce_length_local;
  uint8_t *nonce_local;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  
  local_210 = (uchar *)0x0;
  *plaintext_length = 0;
  operation._444_4_ = psa_aead_setup((aead_operation_t *)&tag,handle,0x200,alg);
  if (operation._444_4_ != 0) {
    return operation._444_4_;
  }
  operation._444_4_ =
       psa_aead_unpadded_locate_tag
                 ((ulong)(byte)operation.ctx._421_1_,ciphertext,ciphertext_length,plaintext_size,
                  &local_210);
  if (operation._444_4_ == 0) {
    if (operation.ctx.gcm.mode == 0x6401002) {
      iVar1 = mbedtls_gcm_auth_decrypt
                        ((mbedtls_gcm_context *)&operation.cipher_info,
                         ciphertext_length - (byte)operation.ctx._421_1_,nonce,nonce_length,
                         additional_data,additional_data_length,local_210,
                         (ulong)(byte)operation.ctx._421_1_,ciphertext,plaintext);
      operation._444_4_ = mbedtls_to_psa_error(iVar1);
    }
    else if (operation.ctx.gcm.mode == 0x6401001) {
      iVar1 = mbedtls_ccm_auth_decrypt
                        ((mbedtls_ccm_context *)&operation.cipher_info,
                         ciphertext_length - (byte)operation.ctx._421_1_,nonce,nonce_length,
                         additional_data,additional_data_length,ciphertext,plaintext,local_210,
                         (ulong)(byte)operation.ctx._421_1_);
      operation._444_4_ = mbedtls_to_psa_error(iVar1);
    }
    else {
      if (operation.ctx.gcm.mode != 0x6001005) {
        return -0x86;
      }
      if ((nonce_length != 0xc) || (operation.ctx._421_1_ != '\x10')) {
        operation.full_tag_length = 'z';
        operation.tag_length = 0xff;
        operation._446_2_ = 0xffff;
        goto LAB_00139c05;
      }
      iVar1 = mbedtls_chachapoly_auth_decrypt
                        ((mbedtls_chachapoly_context *)&operation.cipher_info,
                         ciphertext_length - 0x10,nonce,additional_data,additional_data_length,
                         local_210,ciphertext,plaintext);
      operation._444_4_ = mbedtls_to_psa_error(iVar1);
    }
    if ((operation._444_4_ != 0) && (plaintext_size != 0)) {
      memset(plaintext,0,plaintext_size);
    }
  }
LAB_00139c05:
  psa_aead_abort_internal((aead_operation_t *)&tag);
  if (operation._444_4_ == 0) {
    *plaintext_length = ciphertext_length - (byte)operation.ctx._421_1_;
  }
  pVar2._0_1_ = operation.full_tag_length;
  pVar2._1_1_ = operation.tag_length;
  pVar2._2_2_ = operation._446_2_;
  return pVar2;
}

Assistant:

psa_status_t psa_aead_decrypt( psa_key_handle_t handle,
                               psa_algorithm_t alg,
                               const uint8_t *nonce,
                               size_t nonce_length,
                               const uint8_t *additional_data,
                               size_t additional_data_length,
                               const uint8_t *ciphertext,
                               size_t ciphertext_length,
                               uint8_t *plaintext,
                               size_t plaintext_size,
                               size_t *plaintext_length )
{
    psa_status_t status;
    aead_operation_t operation;
    const uint8_t *tag = NULL;

    *plaintext_length = 0;

    status = psa_aead_setup( &operation, handle, PSA_KEY_USAGE_DECRYPT, alg );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_aead_unpadded_locate_tag( operation.tag_length,
                                           ciphertext, ciphertext_length,
                                           plaintext_size, &tag );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_GCM_C)
    if( operation.core_alg == PSA_ALG_GCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_gcm_auth_decrypt( &operation.ctx.gcm,
                                      ciphertext_length - operation.tag_length,
                                      nonce, nonce_length,
                                      additional_data,
                                      additional_data_length,
                                      tag, operation.tag_length,
                                      ciphertext, plaintext ) );
    }
    else
#endif /* MBEDTLS_GCM_C */
#if defined(MBEDTLS_CCM_C)
    if( operation.core_alg == PSA_ALG_CCM )
    {
        status = mbedtls_to_psa_error(
            mbedtls_ccm_auth_decrypt( &operation.ctx.ccm,
                                      ciphertext_length - operation.tag_length,
                                      nonce, nonce_length,
                                      additional_data,
                                      additional_data_length,
                                      ciphertext, plaintext,
                                      tag, operation.tag_length ) );
    }
    else
#endif /* MBEDTLS_CCM_C */
#if defined(MBEDTLS_CHACHAPOLY_C)
    if( operation.core_alg == PSA_ALG_CHACHA20_POLY1305 )
    {
        if( nonce_length != 12 || operation.tag_length != 16 )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = mbedtls_to_psa_error(
            mbedtls_chachapoly_auth_decrypt( &operation.ctx.chachapoly,
                                             ciphertext_length - operation.tag_length,
                                             nonce,
                                             additional_data,
                                             additional_data_length,
                                             tag,
                                             ciphertext,
                                             plaintext ) );
    }
    else
#endif /* MBEDTLS_CHACHAPOLY_C */
    {
        return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( status != PSA_SUCCESS && plaintext_size != 0 )
        memset( plaintext, 0, plaintext_size );

exit:
    psa_aead_abort_internal( &operation );
    if( status == PSA_SUCCESS )
        *plaintext_length = ciphertext_length - operation.tag_length;
    return( status );
}